

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool qt_normalizePathSegments(QString *path,PathNormalizations flags)

{
  QStringView name;
  QChar *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  QChar *pQVar7;
  const_iterator pQVar8;
  __off_t __length;
  undefined4 in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  anon_enum_32 type;
  bool ok;
  QChar *end;
  QChar *start;
  QChar *out;
  bool lastWasSlash;
  qsizetype n;
  qsizetype i;
  QChar *in;
  qsizetype prefixLength;
  bool isRemote;
  undefined4 in_stack_fffffffffffffe18;
  PathNormalization in_stack_fffffffffffffe1c;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  QString *in_stack_fffffffffffffe28;
  QStringView *in_stack_fffffffffffffe30;
  QChar *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  storage_type_conflict *in_stack_fffffffffffffe48;
  bool local_1a9;
  bool local_199;
  bool local_189;
  bool local_179;
  bool local_169;
  bool local_159;
  bool local_149;
  bool local_131;
  bool local_f9;
  bool local_e9;
  bool local_d9;
  bool local_c9;
  int local_c8;
  QChar *local_b8;
  QChar *local_b0;
  bool local_a1;
  long local_98;
  QChar *local_90;
  bool local_69;
  QChar local_4c;
  QChar local_4a;
  QChar local_48;
  QChar local_46;
  QChar local_44;
  QChar local_42;
  QChar local_40;
  QChar local_3e;
  QChar local_3c;
  QChar local_3a;
  QChar local_38;
  QChar local_36;
  QChar local_34;
  QChar local_32;
  QChar local_30;
  QChar local_2e;
  QChar local_2c;
  QChar local_2a;
  QChar local_28;
  QChar local_26;
  undefined4 local_24;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  bVar2 = QFlags<QDirPrivate::PathNormalization>::testAnyFlag
                    ((QFlags<QDirPrivate::PathNormalization> *)
                     CONCAT17(in_stack_fffffffffffffe27,
                              CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                     in_stack_fffffffffffffe1c);
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_24 = local_c;
  name.m_size._7_1_ = in_stack_fffffffffffffe47;
  name.m_size._0_7_ = in_stack_fffffffffffffe40;
  name.m_data = in_stack_fffffffffffffe48;
  qVar5 = rootLength(name,(QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>)
                          SUB84(in_stack_fffffffffffffe38,0));
  QString::constBegin((QString *)0x2825ba);
  qVar6 = QString::size(in_RDI);
  local_a1 = true;
  for (local_98 = qVar5; local_98 < qVar6; local_98 = local_98 + 1) {
    local_c9 = false;
    if (local_a1 != false) {
      QChar::QChar<char16_t,_true>(&local_26,L'.');
      local_c9 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                              CONCAT16(in_stack_fffffffffffffe26,
                                                       in_stack_fffffffffffffe20)),
                            (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
    if (local_c9 != false) {
      local_d9 = true;
      if (local_98 + 1 != qVar6) {
        QChar::QChar<char16_t,_true>(&local_28,L'/');
        local_d9 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                CONCAT16(in_stack_fffffffffffffe26,
                                                         in_stack_fffffffffffffe20)),
                              (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
                             );
      }
      if (local_d9 != false) break;
      QChar::QChar<char16_t,_true>(&local_2a,L'.');
      bVar4 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                           CONCAT16(in_stack_fffffffffffffe26,
                                                    in_stack_fffffffffffffe20)),
                         (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_e9 = false;
      if (bVar4) {
        local_f9 = true;
        if (local_98 + 2 != qVar6) {
          QChar::QChar<char16_t,_true>(&local_2c,L'/');
          local_f9 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                  CONCAT16(in_stack_fffffffffffffe26,
                                                           in_stack_fffffffffffffe20)),
                                (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                  in_stack_fffffffffffffe18));
        }
        local_e9 = local_f9;
      }
      if (local_e9 != false) break;
    }
    bVar4 = false;
    if ((!bVar2) && (bVar4 = false, local_a1 != false)) {
      QChar::QChar<char16_t,_true>(&local_2e,L'/');
      bVar3 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                           CONCAT16(in_stack_fffffffffffffe26,
                                                    in_stack_fffffffffffffe20)),
                         (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      bVar4 = false;
      if (bVar3) {
        bVar4 = 0 < local_98;
      }
    }
    if (bVar4) {
      local_98 = local_98 + -1;
      break;
    }
    QChar::QChar<char16_t,_true>(&local_30,L'/');
    local_a1 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                            CONCAT16(in_stack_fffffffffffffe26,
                                                     in_stack_fffffffffffffe20)),
                          (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  }
  if (local_98 == qVar6) {
    local_69 = true;
  }
  else {
    local_b0 = QString::data((QString *)
                             CONCAT17(in_stack_fffffffffffffe27,
                                      CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20))
                            );
    local_b8 = local_b0 + qVar5;
    qVar6 = QString::size(in_RDI);
    pQVar7 = local_b0 + qVar6;
    local_b0 = local_b0 + local_98;
    local_69 = true;
    local_90 = local_b0;
    do {
      QChar::QChar<char16_t,_true>(&local_32,L'/');
      bVar4 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                           CONCAT16(in_stack_fffffffffffffe26,
                                                    in_stack_fffffffffffffe20)),
                         (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      if (bVar4) {
        local_b0->ucs = local_90->ucs;
        local_b0 = local_b0 + 1;
        while( true ) {
          local_90 = local_90 + 1;
          local_131 = false;
          if (local_90 < pQVar7) {
            QChar::QChar<char16_t,_true>(&local_34,L'/');
            local_131 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                     CONCAT16(in_stack_fffffffffffffe26,
                                                              in_stack_fffffffffffffe20)),
                                   (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18));
          }
          if (local_131 == false) break;
          if (bVar2) {
            local_b0->ucs = local_90->ucs;
            local_b0 = local_b0 + 1;
          }
        }
      }
      local_c8 = 0;
      QChar::QChar<char16_t,_true>(&local_36,L'.');
      bVar4 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                           CONCAT16(in_stack_fffffffffffffe26,
                                                    in_stack_fffffffffffffe20)),
                         (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      if (bVar4) {
        local_149 = true;
        if (local_90 + 1 != pQVar7) {
          QChar::QChar<char16_t,_true>(&local_38,L'/');
          local_149 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                   CONCAT16(in_stack_fffffffffffffe26,
                                                            in_stack_fffffffffffffe20)),
                                 (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                   in_stack_fffffffffffffe18));
        }
        if (local_149 == false) {
          QChar::QChar<char16_t,_true>(&local_3a,L'.');
          bVar4 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                               CONCAT16(in_stack_fffffffffffffe26,
                                                        in_stack_fffffffffffffe20)),
                             (QChar *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
          ;
          local_159 = false;
          if (bVar4) {
            local_169 = true;
            if (local_90 + 2 != pQVar7) {
              QChar::QChar<char16_t,_true>(&local_3c,L'/');
              local_169 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                       CONCAT16(in_stack_fffffffffffffe26,
                                                                in_stack_fffffffffffffe20)),
                                     (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                       in_stack_fffffffffffffe18));
            }
            local_159 = local_169;
          }
          if (local_159 != false) {
            local_c8 = 2;
          }
        }
        else {
          local_c8 = 1;
        }
      }
      if (local_c8 == 0) {
        while( true ) {
          local_179 = false;
          if (local_90 < pQVar7) {
            QChar::QChar<char16_t,_true>(&local_3e,L'/');
            local_179 = operator!=((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                     CONCAT16(in_stack_fffffffffffffe26,
                                                              in_stack_fffffffffffffe20)),
                                   (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18));
          }
          if (local_179 == false) break;
          local_b0->ucs = local_90->ucs;
          local_b0 = local_b0 + 1;
          local_90 = local_90 + 1;
        }
      }
      else {
        if (local_c8 == 2) {
          if ((local_b0 == local_b8) && (local_69 = false, !bVar2)) {
            QChar::QChar<char16_t,_true>(&local_40,L'.');
            local_b0->ucs = local_40.ucs;
            QChar::QChar<char16_t,_true>(&local_42,L'.');
            local_b0[1].ucs = local_42.ucs;
            pQVar1 = local_b0 + 2;
            if (local_90 + 2 != pQVar7) {
              QChar::QChar<char16_t,_true>(&local_44,L'/');
              local_b0[2].ucs = local_44.ucs;
              local_90 = local_90 + 1;
              pQVar1 = local_b0 + 3;
            }
            local_b0 = pQVar1;
            local_b8 = local_b0;
            local_90 = local_90 + 2;
            goto LAB_002830a6;
          }
          if (local_b8 < local_b0) {
            local_b0 = local_b0 + -1;
          }
          while( true ) {
            local_189 = false;
            if (local_b8 < local_b0) {
              QChar::QChar<char16_t,_true>(&local_46,L'/');
              local_189 = operator!=((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                       CONCAT16(in_stack_fffffffffffffe26,
                                                                in_stack_fffffffffffffe20)),
                                     (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                       in_stack_fffffffffffffe18));
            }
            if (local_189 == false) break;
            local_b0 = local_b0 + -1;
          }
          local_90 = local_90 + 2;
        }
        else {
          local_90 = local_90 + 1;
        }
        local_199 = false;
        if ((local_90 != pQVar7) && (local_199 = false, local_b8 < local_b0)) {
          QChar::QChar<char16_t,_true>(&local_48,L'/');
          local_199 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                   CONCAT16(in_stack_fffffffffffffe26,
                                                            in_stack_fffffffffffffe20)),
                                 (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                   in_stack_fffffffffffffe18));
        }
        if (local_199 != false) {
          local_b0 = local_b0 + -1;
        }
        if (local_b0 == local_b8) {
          local_1a9 = false;
          if (local_90 != pQVar7) {
            QChar::QChar<char16_t,_true>(&local_4a,L'/');
            local_1a9 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                     CONCAT16(in_stack_fffffffffffffe26,
                                                              in_stack_fffffffffffffe20)),
                                   (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18));
          }
          if (local_1a9 != false) {
            local_90 = local_90 + 1;
          }
          while( true ) {
            bVar4 = false;
            if ((qVar5 == 0) && (bVar4 = false, local_90 != pQVar7)) {
              in_stack_fffffffffffffe38 = local_90;
              QChar::QChar<char16_t,_true>(&local_4c,L'/');
              bVar4 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                   CONCAT16(in_stack_fffffffffffffe26,
                                                            in_stack_fffffffffffffe20)),
                                 (QChar *)CONCAT44(in_stack_fffffffffffffe1c,
                                                   in_stack_fffffffffffffe18));
            }
            if (bVar4 == false) break;
            local_90 = local_90 + 1;
          }
        }
      }
LAB_002830a6:
    } while (local_90 < pQVar7);
    pQVar8 = QString::constBegin((QString *)0x2830e3);
    QString::truncate(in_RDI,(char *)((long)local_b0 - (long)pQVar8 >> 1),__length);
    if ((!bVar2) && (bVar2 = QString::isEmpty((QString *)0x28310f), bVar2)) {
      Qt::Literals::StringLiterals::operator____s(&in_stack_fffffffffffffe38->ucs,(size_t)in_RDI);
      QString::operator=((QString *)
                         CONCAT17(in_stack_fffffffffffffe27,
                                  CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                         (QString *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      QString::~QString((QString *)0x283150);
    }
    local_69 = local_69 || qVar5 == 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool qt_normalizePathSegments(QString *path, QDirPrivate::PathNormalizations flags)
{
    const bool isRemote = flags.testAnyFlag(QDirPrivate::RemotePath);
    const qsizetype prefixLength = rootLength(*path, flags);

    // RFC 3986 says: "The input buffer is initialized with the now-appended
    // path components and the output buffer is initialized to the empty
    // string."
    const QChar *in = path->constBegin();

    // Scan the input for a "." or ".." segment. If there isn't any, we may not
    // need to modify this path at all. Also scan for "//" segments, which
    // will be normalized if the path is local.
    qsizetype i = prefixLength;
    qsizetype n = path->size();
    for (bool lastWasSlash = true; i < n; ++i) {
        if (lastWasSlash && in[i] == u'.') {
            if (i + 1 == n || in[i + 1] == u'/')
                break;
            if (in[i + 1] == u'.' && (i + 2 == n || in[i + 2] == u'/'))
                break;
        }
        if (!isRemote && lastWasSlash && in[i] == u'/' && i > 0) {
            // backtrack one, so the algorithm below gobbles up the remaining
            // slashes
            --i;
            break;
        }
        lastWasSlash = in[i] == u'/';
    }
    if (i == n)
        return true;

    QChar *out = path->data();  // detaches
    const QChar *start = out + prefixLength;
    const QChar *end = out + path->size();
    out += i;
    in = out;

    // We implement a modified algorithm compared to RFC 3986, for efficiency.
    bool ok = true;
    do {
#if 0   // to see in the debugger
        QString output = QStringView(path->constBegin(), out).toString();
        QStringView input(in, end);
#endif

        // First, copy the preceding slashes, so we can look at the segment's
        // content. If the path is part of a URL, we copy all slashes, otherwise
        // just one.
        if (in[0] == u'/') {
            *out++ = *in++;
            while (in < end && in[0] == u'/') {
                if (isRemote)
                    *out++ = *in++;
                else
                    ++in; // Skip multiple slashes for local URLs

                // Note: we may exit this loop with in == end, in which case we
                // *shouldn't* dereference *in. But since we are pointing to a
                // detached, non-empty QString, we know there's a u'\0' at the
                // end, so dereferencing is safe.
            }
        }

        // Is this path segment either "." or ".."?
        enum { Nothing, Dot, DotDot } type = Nothing;
        if (in[0] == u'.') {
            if (in + 1 == end || in[1] == u'/')
                type = Dot;
            else if (in[1] == u'.' && (in + 2 == end || in[2] == u'/'))
                type = DotDot;
        }
        if (type == Nothing) {
            // If it is neither, then we copy this segment.
            while (in < end && in[0] != u'/')
                *out++ = *in++;
            continue;
        }

        // Otherwise, we skip it and remove preceding slashes (if
        // any, exactly one if part of a URL, all otherwise) from the
        // output. If it is "..", we remove the segment before that and
        // preceding slashes too in a similar fashion, if they are there.
        if (type == DotDot) {
            if (Q_UNLIKELY(out == start)) {
                // we can't go further up from here, so we "re-root"
                // without cleaning this segment
                ok = false;
                if (!isRemote) {
                    *out++ = u'.';
                    *out++ = u'.';
                    if (in + 2 != end) {
                        Q_ASSERT(in[2] == u'/');
                        *out++ = u'/';
                        ++in;
                    }
                    start = out;
                    in += 2;
                    continue;
                }
            }

            if (out > start)
                --out; // backtrack the first dot
            // backtrack the previous path segment
            while (out > start && out[-1] != u'/')
                --out;
            in += 2;    // the two dots
        } else {
            ++in;       // the one dot
        }

        // Not at 'end' yet, prepare for the next loop iteration by backtracking one slash.
        // E.g.: /a/b/../c    >>> /a/b/../c
        //          ^out            ^out
        // the next iteration will copy '/c' to the output buffer >>> /a/c
        if (in != end && out > start && out[-1] == u'/')
            --out;
        if (out == start) {
            // We've reached the root. Make sure we don't turn a relative path
            // to absolute or, in the case of local paths that are already
            // absolute, into UNC.
            // Note: this will turn ".//a" into "a" even for URLs!
            if (in != end && in[0] == u'/')
                ++in;
            while (prefixLength == 0 && in != end && in[0] == u'/')
                ++in;
        }
    } while (in < end);

    path->truncate(out - path->constBegin());
    if (!isRemote && path->isEmpty())
        *path = u"."_s;

    // we return false only if the path was absolute
    return ok || prefixLength == 0;
}